

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::javanano::ToJavaName
                   (string *__return_storage_ptr__,Params *params,string *name,bool is_class,
                   Descriptor *parent,FileDescriptor *file)

{
  bool bVar1;
  undefined7 in_register_00000009;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (parent == (Descriptor *)0x0) {
    if (is_class) {
      bVar1 = Params::java_multiple_files(params,*(string **)file);
      if (bVar1) {
        FileJavaPackage_abi_cxx11_
                  (&local_40,(javanano *)params,(Params *)file,
                   (FileDescriptor *)CONCAT71(in_register_00000009,is_class));
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        goto LAB_00251aea;
      }
    }
    ClassName_abi_cxx11_
              (&local_40,(javanano *)params,(Params *)file,
               (FileDescriptor *)CONCAT71(in_register_00000009,is_class));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    ClassName_abi_cxx11_
              (&local_40,(javanano *)params,(Params *)parent,
               (Descriptor *)CONCAT71(in_register_00000009,is_class));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
LAB_00251aea:
  std::__cxx11::string::~string((string *)&local_40);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  RenameJavaKeywords(&local_40,name);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string ToJavaName(const Params& params, const string& name, bool is_class,
    const Descriptor* parent, const FileDescriptor* file) {
  string result;
  if (parent != NULL) {
    result.append(ClassName(params, parent));
  } else if (is_class && params.java_multiple_files(file->name())) {
    result.append(FileJavaPackage(params, file));
  } else {
    result.append(ClassName(params, file));
  }
  if (!result.empty()) result.append(1, '.');
  result.append(RenameJavaKeywords(name));
  return result;
}